

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

void Abc_NtkReverse_rec(Abc_Obj_t *pObj,Vec_Int_t *vVisited)

{
  int iVar1;
  long lVar2;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 != 0) {
    return;
  }
  Abc_NodeSetTravIdCurrent(pObj);
  for (lVar2 = 0; lVar2 < (pObj->vFanouts).nSize; lVar2 = lVar2 + 1) {
    Abc_NtkReverse_rec((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar2]],
                       vVisited);
  }
  Vec_IntPush(vVisited,pObj->Id);
  return;
}

Assistant:

void Abc_NtkReverse_rec( Abc_Obj_t * pObj, Vec_Int_t * vVisited )
{
    Abc_Obj_t * pNext;
    int i;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    Abc_ObjForEachFanout( pObj, pNext, i )
        Abc_NtkReverse_rec( pNext, vVisited );
    Vec_IntPush( vVisited, Abc_ObjId(pObj) );
}